

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O0

int main(void)

{
  int iVar1;
  
  plan(6);
  _space(_stdout);
  printf("# *** %s ***\n","main");
  quota_init(&quota,0xffffffff);
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  test_ibuf_basic();
  test_ibuf_shrink();
  test_ibuf_truncate();
  test_ibuf_discard();
  test_ibuf_consume();
  test_ibuf_consume_before();
  slab_cache_destroy(&cache);
  _space(_stdout);
  printf("# *** %s: done ***\n","main");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(7);
#else
	plan(6);
#endif
	header();

	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0,
			  4000000, MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	test_ibuf_basic();
	test_ibuf_shrink();
	test_ibuf_truncate();
	test_ibuf_discard();
	test_ibuf_consume();
	test_ibuf_consume_before();
#ifdef ENABLE_ASAN
	test_ibuf_poison();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}